

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_solver.cpp
# Opt level: O0

void __thiscall WorldSolver::WorldSolver(WorldSolver *this,RandomizerWorld *world)

{
  RandomizerWorld *world_local;
  WorldSolver *this_local;
  
  this->_world = world;
  this->_start_node = (WorldNode *)0x0;
  this->_end_node = (WorldNode *)0x0;
  std::
  map<Item_*,_unsigned_short,_std::less<Item_*>,_std::allocator<std::pair<Item_*const,_unsigned_short>_>_>
  ::map(&this->_forbidden_items);
  std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::vector
            (&this->_forbidden_nodes_to_pick_items);
  std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::vector(&this->_explored_nodes);
  std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::vector(&this->_nodes_to_explore);
  std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::vector(&this->_blocked_paths);
  std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::vector(&this->_reachable_item_sources);
  std::vector<Item_*,_std::allocator<Item_*>_>::vector(&this->_relevant_items);
  std::vector<Item_*,_std::allocator<Item_*>_>::vector(&this->_starting_inventory);
  std::vector<Item_*,_std::allocator<Item_*>_>::vector(&this->_inventory);
  std::
  vector<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>
  ::vector(&this->_scheduled_item_placements);
  this->_step_count = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->_debug_log,(nullptr_t)0x0);
  return;
}

Assistant:

WorldSolver::WorldSolver(const RandomizerWorld& world) : _world (world)
{}